

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void __thiscall
icu_63::NFRule::stripPrefix
          (NFRule *this,UnicodeString *text,UnicodeString *prefix,ParsePosition *pp)

{
  ParsePosition *this_00;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  UErrorCode local_2c;
  int32_t pfl;
  UErrorCode status;
  ParsePosition *pp_local;
  UnicodeString *prefix_local;
  UnicodeString *text_local;
  NFRule *this_local;
  
  _pfl = pp;
  pp_local = (ParsePosition *)prefix;
  prefix_local = text;
  text_local = (UnicodeString *)this;
  iVar2 = UnicodeString::length(prefix);
  if (iVar2 != 0) {
    local_2c = U_ZERO_ERROR;
    iVar2 = prefixLength(this,prefix_local,(UnicodeString *)pp_local,&local_2c);
    UVar1 = ::U_FAILURE(local_2c);
    this_00 = _pfl;
    if ((UVar1 == '\0') && (iVar2 != 0)) {
      iVar3 = ParsePosition::getIndex(_pfl);
      ParsePosition::setIndex(this_00,iVar3 + iVar2);
      UnicodeString::remove(prefix_local,(char *)0x0);
    }
  }
  return;
}

Assistant:

void
NFRule::stripPrefix(UnicodeString& text, const UnicodeString& prefix, ParsePosition& pp) const
{
    // if the prefix text is empty, dump out without doing anything
    if (prefix.length() != 0) {
    	UErrorCode status = U_ZERO_ERROR;
        // use prefixLength() to match the beginning of
        // "text" against "prefix".  This function returns the
        // number of characters from "text" that matched (or 0 if
        // we didn't match the whole prefix)
        int32_t pfl = prefixLength(text, prefix, status);
        if (U_FAILURE(status)) { // Memory allocation error.
        	return;
        }
        if (pfl != 0) {
            // if we got a successful match, update the parse position
            // and strip the prefix off of "text"
            pp.setIndex(pp.getIndex() + pfl);
            text.remove(0, pfl);
        }
    }
}